

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O3

string * __thiscall
iDynTree::MatrixDynSize::toString_abi_cxx11_(string *__return_storage_ptr__,MatrixDynSize *this)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->m_rows != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar1 = this->m_cols;
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             (*(double *)((long)this->m_data + uVar3 * 8 + uVar1 * lVar5));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          uVar3 = uVar3 + 1;
          uVar1 = this->m_cols;
        } while (uVar3 < uVar1);
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < this->m_rows);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string MatrixDynSize::toString() const
{
    std::stringstream ss;

    for(std::size_t row=0; row < this->rows(); row++ )
    {
        for(std::size_t col=0; col < this->cols(); col++ )
        {
            ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
        }
        ss << std::endl;
    }

    return ss.str();
}